

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BasicReporter::ReportCounts
          (BasicReporter *this,string *label,Counts *counts,string *allPrefix)

{
  ostream *poVar1;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [40];
  
  poVar1 = (this->m_config).stream;
  if (counts->passed != 0) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," of ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)label);
    std::operator<<(poVar1,"s failed");
    return;
  }
  if (counts->failed < 2) {
    std::__cxx11::string::string<std::allocator<char>>(local_68,"",&local_69);
  }
  else {
    std::__cxx11::string::string(local_68,(string *)allPrefix);
  }
  poVar1 = std::operator<<(poVar1,local_68);
  local_48._0_8_ = counts->failed;
  std::__cxx11::string::string((string *)(local_48 + 8),(string *)label);
  poVar1 = operator<<(poVar1,(pluralise *)local_48);
  std::operator<<(poVar1," failed");
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void ReportCounts( const std::string& label, const Counts& counts, const std::string& allPrefix = "All " ) {
            if( counts.passed )
                m_config.stream << counts.failed << " of " << counts.total() << " " << label << "s failed";
            else
                m_config.stream << ( counts.failed > 1 ? allPrefix : "" ) << pluralise( counts.failed, label ) << " failed";
        }